

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_xml.c
# Opt level: O1

genxWriter p2sc_xml_start(p2sc_buffer_t *buf)

{
  genxStatus gVar1;
  genxWriter w;
  char *pcVar2;
  
  w = genxNew((_func_void_ptr_void_ptr_int *)0x0,(_func_void_void_ptr_void_ptr *)0x0,buf);
  if (buf == (p2sc_buffer_t *)0x0) {
    gVar1 = genxStartDocFile(w,_stdout);
  }
  else {
    gVar1 = genxStartDocSender(w,&bufSender);
  }
  if (gVar1 == GENX_SUCCESS) {
    return w;
  }
  pcVar2 = genxLastErrorMessage(w);
  _p2sc_msg("p2sc_xml_start",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_xml.c"
            ,0x6a,"$Id: p2sc_xml.c 5108 2014-06-19 12:29:23Z bogdan $",0x12c0,"Genx: %s",pcVar2);
  exit(1);
}

Assistant:

genxWriter p2sc_xml_start(p2sc_buffer_t *buf) {
    genxStatus status;
    genxWriter w = genxNew(NULL, NULL, buf);

    /* if buf is NULL, write to stdout */
    if (buf)
        status = genxStartDocSender(w, &bufSender);
    else
        status = genxStartDocFile(w, stdout);

    GENX_Try(w, status);

    return w;
}